

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::
emplace_back<(anonymous_namespace)::Constructable&>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,Constructable *args)

{
  iterator this_00;
  Constructable *in_RSI;
  SmallVectorBase<(anonymous_namespace)::Constructable> *in_RDI;
  Constructable *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<(anonymous_namespace)::Constructable> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<(anonymous_namespace)::Constructable&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    this_00 = end(in_RDI);
    anon_unknown.dwarf_70180c::Constructable::Constructable(this_00,in_RSI);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }